

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

size_t mbedtls_ssl_get_max_frag_len(mbedtls_ssl_context *ssl)

{
  ulong local_18;
  size_t max_len;
  mbedtls_ssl_context *ssl_local;
  
  local_18 = (ulong)mfl_code_to_length[*(uint *)&ssl->conf->field_0x164 >> 7 & 7];
  if ((ssl->session_out != (mbedtls_ssl_session *)0x0) &&
     (mfl_code_to_length[ssl->session_out->mfl_code] < local_18)) {
    local_18 = (ulong)mfl_code_to_length[ssl->session_out->mfl_code];
  }
  return local_18;
}

Assistant:

size_t mbedtls_ssl_get_max_frag_len( const mbedtls_ssl_context *ssl )
{
    size_t max_len;

    /*
     * Assume mfl_code is correct since it was checked when set
     */
    max_len = mfl_code_to_length[ssl->conf->mfl_code];

    /*
     * Check if a smaller max length was negotiated
     */
    if( ssl->session_out != NULL &&
        mfl_code_to_length[ssl->session_out->mfl_code] < max_len )
    {
        max_len = mfl_code_to_length[ssl->session_out->mfl_code];
    }

    return max_len;
}